

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileDescriptor::GetSourceLocation
          (FileDescriptor *this,vector<int,_std::allocator<int>_> *path,SourceLocation *out_location
          )

{
  int iVar1;
  Rep *pRVar2;
  LogMessage *pLVar3;
  SourceCodeInfo_Location *pSVar4;
  int *piVar5;
  void **ppvVar6;
  RepeatedField<int> *this_00;
  LogFinisher local_d9;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (out_location == (SourceLocation *)0x0) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0xdd4);
    pLVar3 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: out_location != nullptr: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar3);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  if (((*(SourceCodeInfo **)(this + 0x88) != (SourceCodeInfo *)0x0) &&
      (pSVar4 = FileDescriptorTables::GetSourceLocation
                          (*(FileDescriptorTables **)(this + 0x80),path,
                           *(SourceCodeInfo **)(this + 0x88)),
      pSVar4 != (SourceCodeInfo_Location *)0x0)) &&
     (iVar1 = (pSVar4->span_).current_size_, iVar1 - 3U < 2)) {
    if (iVar1 < 1) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x280);
      pLVar3 = internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar3);
      internal::LogMessage::~LogMessage(&local_68);
    }
    this_00 = &pSVar4->span_;
    piVar5 = RepeatedField<int>::elements(this_00);
    out_location->start_line = *piVar5;
    if (this_00->current_size_ < 2) {
      internal::LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x280);
      pLVar3 = internal::LogMessage::operator<<
                         (&local_d8,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=(&local_d9,pLVar3);
      internal::LogMessage::~LogMessage(&local_d8);
    }
    piVar5 = RepeatedField<int>::elements(this_00);
    out_location->start_column = piVar5[1];
    piVar5 = RepeatedField<int>::Get(this_00,(uint)((pSVar4->span_).current_size_ != 3) * 2);
    out_location->end_line = *piVar5;
    piVar5 = RepeatedField<int>::Get(this_00,(pSVar4->span_).current_size_ + -1);
    out_location->end_column = *piVar5;
    std::__cxx11::string::_M_assign((string *)&out_location->leading_comments);
    std::__cxx11::string::_M_assign((string *)&out_location->trailing_comments);
    pRVar2 = (pSVar4->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
    ppvVar6 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      ppvVar6 = (void **)0x0;
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &out_location->leading_detached_comments,ppvVar6,
               ppvVar6 + (pSVar4->leading_detached_comments_).super_RepeatedPtrFieldBase.
                         current_size_);
    return true;
  }
  return false;
}

Assistant:

bool FileDescriptor::GetSourceLocation(const std::vector<int>& path,
                                       SourceLocation* out_location) const {
  GOOGLE_CHECK(out_location != nullptr);
  if (source_code_info_) {
    if (const SourceCodeInfo_Location* loc =
            tables_->GetSourceLocation(path, source_code_info_)) {
      const RepeatedField<int32_t>& span = loc->span();
      if (span.size() == 3 || span.size() == 4) {
        out_location->start_line = span.Get(0);
        out_location->start_column = span.Get(1);
        out_location->end_line = span.Get(span.size() == 3 ? 0 : 2);
        out_location->end_column = span.Get(span.size() - 1);

        out_location->leading_comments = loc->leading_comments();
        out_location->trailing_comments = loc->trailing_comments();
        out_location->leading_detached_comments.assign(
            loc->leading_detached_comments().begin(),
            loc->leading_detached_comments().end());
        return true;
      }
    }
  }
  return false;
}